

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  reference pcVar2;
  Value *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  const_iterator iter;
  string *comment;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff98;
  StyledWriter *in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  CommentPlacement placement;
  Value *in_stack_ffffffffffffffc8;
  
  placement = (CommentPlacement)((ulong)in_stack_ffffffffffffffc0._M_current >> 0x20);
  bVar1 = Value::hasComment(in_RSI,commentBefore);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 4),"\n");
    writeIndent(in_stack_ffffffffffffffa0);
    Value::getComment_abi_cxx11_(in_stack_ffffffffffffffc8,placement);
    std::__cxx11::string::begin();
    while( true ) {
      std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff8f,
                                            CONCAT16(in_stack_ffffffffffffff8e,
                                                     in_stack_ffffffffffffff88)));
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xffffffffffffffc0);
      std::__cxx11::string::operator+=((string *)(in_RDI + 4),*pcVar2);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xffffffffffffffc0);
      in_stack_ffffffffffffff8f = false;
      if (*pcVar2 == '\n') {
        in_stack_ffffffffffffffa0 = (StyledWriter *)std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator!=
                          (in_RDI,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)CONCAT17(in_stack_ffffffffffffff8f,
                                              CONCAT16(in_stack_ffffffffffffff8e,
                                                       in_stack_ffffffffffffff88)));
        in_stack_ffffffffffffff8e = false;
        in_stack_ffffffffffffff8f = in_stack_ffffffffffffff8e;
        if (bVar1) {
          in_stack_ffffffffffffff98 =
               __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(in_stack_ffffffffffffff98._M_current,(difference_type)in_RDI);
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&stack0xffffffffffffff98);
          in_stack_ffffffffffffff8e = *pcVar2 == '/';
          in_stack_ffffffffffffff8f = in_stack_ffffffffffffff8e;
        }
      }
      if ((bool)in_stack_ffffffffffffff8f != false) {
        writeIndent(in_stack_ffffffffffffffa0);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffffc0);
    }
    std::__cxx11::string::operator+=((string *)(in_RDI + 4),"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += "\n";
  writeIndent();
  const std::string& comment = root.getComment(commentBefore);
  std::string::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    document_ += *iter;
    if (*iter == '\n' &&
       (iter != comment.end() && *(iter + 1) == '/'))
      writeIndent();
    ++iter;
  }

  // Comments are stripped of trailing newlines, so add one here
  document_ += "\n";
}